

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_attributes(char **begin,char *end,element_t *element,plutosvg_document_t *document)

{
  byte bVar1;
  plutosvg_document_t *document_00;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  hashmap_t *phVar5;
  hashmap_entry_t **pphVar6;
  hashmap_entry *phVar7;
  ulong uVar8;
  hashmap_entry_t **pphVar9;
  size_t sVar10;
  hashmap_entry_t *phVar11;
  byte *end_00;
  size_t sVar12;
  byte *end_01;
  int iVar13;
  hashmap_entry **pphVar14;
  byte *pbVar15;
  bool bVar16;
  byte *local_70;
  byte *local_68;
  element_t *local_60;
  size_t local_58;
  hashmap_t *local_50;
  heap_t *local_48;
  char **local_40;
  plutosvg_document_t *local_38;
  
  local_60 = element;
  local_40 = begin;
  local_38 = document;
  do {
    pbVar15 = (byte *)*begin;
    if ((end <= pbVar15) ||
       (((bVar1 = *pbVar15, 0x19 < (byte)((bVar1 & 0xdf) + 0xbf) && (bVar1 != 0x5f)) &&
        (bVar1 != 0x3a)))) {
      *local_40 = (char *)pbVar15;
      return true;
    }
    sVar12 = 1;
    while ((local_70 = pbVar15 + sVar12, local_70 < end &&
           (((bVar1 = *local_70, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a || (bVar1 == 0x3a)) ||
            ((bVar1 == 0x5f || ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 - 0x2d) < 2))))))) {
      sVar12 = sVar12 + 1;
    }
    iVar3 = lookupid((char *)pbVar15,sVar12,(name_entry_t *)attributeid_table,0x300);
    skip_ws((char **)&local_70,end);
    if ((end <= local_70) || (*local_70 != 0x3d)) {
      return false;
    }
    local_70 = local_70 + 1;
    skip_ws((char **)&local_70,end);
    if (end <= local_70) {
      return false;
    }
    bVar1 = *local_70;
    if ((bVar1 != 0x27) && (bVar1 != 0x22)) {
      return false;
    }
    local_70 = local_70 + 1;
    skip_ws((char **)&local_70,end);
    pbVar15 = local_70;
    end_00 = local_70;
    while( true ) {
      if (end <= end_00) {
        return false;
      }
      if (*end_00 == bVar1) break;
      end_00 = end_00 + 1;
    }
    bVar16 = local_60 != (element_t *)0x0;
    pcVar4 = rtrim((char *)local_70,(char *)end_00);
    document_00 = local_38;
    if (iVar3 != 0 && bVar16) {
      iVar13 = (int)pcVar4 - (int)pbVar15;
      if (iVar3 == 0x25) {
        end_01 = pbVar15 + iVar13;
        while ((pbVar15 < end_01 &&
               ((bVar1 = *pbVar15, (byte)(bVar1 + 0x9f) < 0x1a ||
                (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a))))) {
          for (sVar12 = 1;
              (local_68 = pbVar15 + sVar12, local_68 < end_01 &&
              (((bVar1 = *local_68, (byte)(bVar1 + 0x9f) < 0x1a ||
                (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a)) ||
               (bVar1 == 0x2d || (byte)(bVar1 - 0x30) < 10)))); sVar12 = sVar12 + 1) {
          }
          iVar3 = lookupid((char *)pbVar15,sVar12,(name_entry_t *)cssattributeid_table,0x130);
          skip_ws((char **)&local_68,(char *)end_01);
          if ((end_01 <= local_68) || (*local_68 != 0x3a)) break;
          local_68 = local_68 + 1;
          skip_ws((char **)&local_68,(char *)end_01);
          pbVar15 = local_68;
          for (; (local_68 < end_01 && (*local_68 != 0x3b)); local_68 = local_68 + 1) {
          }
          pcVar4 = rtrim((char *)pbVar15,(char *)local_68);
          if (iVar3 != 0) {
            add_attribute(local_60,document_00,iVar3,(char *)pbVar15,
                          (long)((int)pcVar4 - (int)pbVar15));
          }
          skip_ws_delim((char **)&local_68,(char *)end_01,';');
          pbVar15 = local_68;
        }
      }
      else if (iVar3 == 0x12) {
        phVar5 = local_38->id_cache;
        if (phVar5 == (hashmap_t *)0x0) {
          phVar5 = (hashmap_t *)malloc(0x18);
          pphVar6 = (hashmap_entry_t **)calloc(0x10,8);
          phVar5->buckets = pphVar6;
          phVar5->size = 0;
          phVar5->capacity = 0x10;
          document_00->id_cache = phVar5;
        }
        local_48 = document_00->heap;
        local_58 = (size_t)iVar13;
        sVar12 = hashmap_hash((char *)pbVar15,local_58);
        pphVar14 = phVar5->buckets + (phVar5->capacity - 1 & sVar12);
        local_50 = phVar5;
        while (phVar11 = *pphVar14, phVar11 != (hashmap_entry_t *)0x0) {
          if ((phVar11->hash == sVar12) &&
             (_Var2 = hashmap_eq(phVar11,(char *)pbVar15,local_58), _Var2)) {
            phVar11->value = local_60;
            goto LAB_00104081;
          }
          pphVar14 = &phVar11->next;
        }
        phVar7 = (hashmap_entry *)heap_alloc(local_48,0x28);
        phVar5 = local_50;
        (phVar7->name).data = (char *)pbVar15;
        (phVar7->name).length = local_58;
        phVar7->hash = sVar12;
        phVar7->value = local_60;
        phVar7->next = (hashmap_entry *)0x0;
        *pphVar14 = phVar7;
        sVar12 = local_50->capacity;
        uVar8 = local_50->size + 1;
        local_50->size = uVar8;
        if (sVar12 * 3 >> 2 < uVar8) {
          local_58 = sVar12 * 2;
          pphVar9 = (hashmap_entry_t **)calloc(local_58,8);
          pphVar6 = phVar5->buckets;
          for (sVar10 = 0; sVar10 != sVar12; sVar10 = sVar10 + 1) {
            phVar11 = pphVar6[sVar10];
            while (phVar11 != (hashmap_entry_t *)0x0) {
              phVar7 = phVar11->next;
              uVar8 = phVar11->hash & sVar12 * 2 - 1;
              phVar11->next = pphVar9[uVar8];
              pphVar9[uVar8] = phVar11;
              phVar11 = phVar7;
            }
          }
          free(pphVar6);
          local_50->buckets = pphVar9;
          local_50->capacity = local_58;
        }
      }
      else {
        add_attribute(local_60,local_38,iVar3,(char *)pbVar15,(long)iVar13);
      }
    }
LAB_00104081:
    local_70 = end_00 + 1;
    begin = (char **)&local_70;
    skip_ws(begin,end);
  } while( true );
}

Assistant:

static bool parse_attributes(const char** begin, const char* end, element_t* element, plutosvg_document_t* document)
{
    const char* it = *begin;
    while(it < end && IS_STARTNAMECHAR(*it)) {
        const char* data = it++;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        int id = attributeid(data, it - data);
        skip_ws(&it, end);
        if(it >= end || *it != '=')
            return false;
        ++it;
        skip_ws(&it, end);
        if(it >= end || (*it != '"' && *it != '\''))
            return false;
        const char quote = *it++;
        skip_ws(&it, end);
        data = it;
        while(it < end && *it != quote)
            ++it;
        if(it >= end || *it != quote)
            return false;
        int length = rtrim(data, it) - data;
        if(id && element) {
            if(id == ATTR_ID) {
                if(document->id_cache == NULL)
                    document->id_cache = hashmap_create();
                hashmap_put(document->id_cache, document->heap, data, length, element);
            } else if(id == ATTR_STYLE) {
                parse_style(data, length, element, document);
            } else {
                add_attribute(element, document, id, data, length);
            }
        }

        ++it;
        skip_ws(&it, end);
    }

    *begin = it;
    return true;
}